

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O0

positionTy *
LTAptFindRwy(FlightModel *_mdl,positionTy *_from,double _speed_m_s,string *_rwyId,string *_logTxt)

{
  bool bVar1;
  uint uVar2;
  logLevelTy lVar3;
  pointer ppVar4;
  reference pRVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  string *in_RCX;
  positionTy *in_RDX;
  long in_RSI;
  int iVar10;
  positionTy *in_RDI;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  char *szPath;
  double vsi;
  double agl;
  double d_ts;
  double dist;
  double headingDiff;
  double bearing;
  RwyEndPt *re;
  const_iterator __end2;
  const_iterator __begin2;
  vecRwyEndPtTy *__range2;
  Apt *apt;
  const_iterator iterApt;
  lock_guard<std::mutex> lock;
  double bestArrivalTS;
  double bestHeadingDiff;
  RwyEndPt *bestRwyEndPt;
  Apt *bestApt;
  double vsi_max;
  double vsi_min;
  Apt *in_stack_fffffffffffffdf8;
  __normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
  *in_stack_fffffffffffffe00;
  double in_stack_fffffffffffffe10;
  double in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  double in_stack_fffffffffffffe28;
  string *this;
  double in_stack_fffffffffffffe30;
  double in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  double in_stack_fffffffffffffe48;
  double in_stack_fffffffffffffe50;
  positionTy *in_stack_fffffffffffffeb8;
  string local_120 [16];
  __normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
  local_98 [3];
  vecRwyEndPtTy *local_80;
  Apt *local_78;
  _Self local_70;
  _Self local_68 [2];
  double local_58;
  double local_50;
  reference local_48;
  Apt *local_40;
  double local_38;
  double local_30;
  string *local_20;
  double local_18;
  positionTy *local_10;
  long local_8;
  positionTy *ppVar11;
  
  local_30 = -*(double *)(in_RSI + 0x60) * 0.00508;
  local_38 = *(double *)(in_RSI + 0x48) * 0.5 * 0.00508;
  local_18 = in_XMM0_Qa;
  if ((*(double *)(in_RSI + 200) * 0.8) / 1.94384 < in_XMM0_Qa) {
    local_18 = (*(double *)(in_RSI + 200) * 0.8) / 1.94384;
  }
  local_40 = (Apt *)0x0;
  local_48 = (reference)0x0;
  local_50 = 15.0;
  local_58 = NAN;
  local_20 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffe00,
             (mutex_type *)in_stack_fffffffffffffdf8);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
       ::cbegin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
                 *)in_stack_fffffffffffffdf8);
  do {
    local_70._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
         ::cend((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>_>
                 *)in_stack_fffffffffffffdf8);
    bVar1 = std::operator!=(local_68,&local_70);
    if (!bVar1) {
      if ((local_48 == (reference)0x0) || (local_40 == (Apt *)0x0)) {
        uVar6 = std::__cxx11::string::empty();
        if (((uVar6 & 1) == 0) && (lVar3 = DataRefs::GetLogLevel(&dataRefs), (int)lVar3 < 1)) {
          uVar7 = std::__cxx11::string::c_str();
          szPath = (char *)positionTy::heading(local_10);
          LogMsg(szPath,0x38aa70,(char *)0xa79,0x38ad86,(char *)0x0,
                 "Didn\'t find runway for %s with heading %.0f",uVar7);
        }
        std::__cxx11::string::clear();
        positionTy::positionTy(in_RDI);
      }
      else {
        positionTy::positionTy
                  (in_RDI,(local_48->super_TaxiNode).lat,(local_48->super_TaxiNode).lon,
                   local_48->alt_m,local_58,local_48->heading,*(double *)(local_8 + 0x110),0.0,
                   GND_ON,UNIT_WORLD,UNIT_DEG,FPH_TOUCH_DOWN);
        *(byte *)&in_RDI->f = *(byte *)&in_RDI->f | 0x80;
        (in_RDI->f).field_0x1 = (in_RDI->f).field_0x1 | 0x30;
        Apt::GetId_abi_cxx11_(in_stack_fffffffffffffdf8);
        this = (string *)&stack0xffffffffffffff00;
        std::__cxx11::string::operator=(local_20,this);
        std::__cxx11::string::~string(this);
        std::__cxx11::string::operator+=(local_20,'/');
        std::__cxx11::string::operator+=(local_20,(string *)&local_48->id);
        uVar6 = std::__cxx11::string::empty();
        if (((uVar6 & 1) == 0) && (lVar3 = DataRefs::GetLogLevel(&dataRefs), (int)lVar3 < 1)) {
          uVar7 = std::__cxx11::string::c_str();
          positionTy::operator_cast_to_string(in_stack_fffffffffffffeb8);
          uVar8 = std::__cxx11::string::c_str();
          uVar9 = std::__cxx11::string::c_str();
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
                 ,0xa92,"LTAptFindRwy",logDEBUG,"Found runway %s at %s for %s",uVar7,uVar8,uVar9);
          std::__cxx11::string::~string(local_120);
        }
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1a3a75);
      return in_RDI;
    }
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>
                           *)0x1a3394);
    local_78 = &ppVar4->second;
    local_80 = Apt::GetRwyEndPtVec(local_78);
    local_98[0]._M_current =
         (RwyEndPt *)
         std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>::begin
                   ((vector<RwyEndPt,_std::allocator<RwyEndPt>_> *)in_stack_fffffffffffffdf8);
    std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>::end
              ((vector<RwyEndPt,_std::allocator<RwyEndPt>_> *)in_stack_fffffffffffffdf8);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffe00,
                              (__normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
                               *)in_stack_fffffffffffffdf8), bVar1) {
      pRVar5 = __gnu_cxx::
               __normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>
               ::operator*(local_98);
      in_stack_fffffffffffffeb8 = (positionTy *)pRVar5->heading;
      ppVar11 = local_10;
      positionTy::heading(local_10);
      iVar10 = (int)ppVar11;
      HeadingDiff(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::abs(iVar10);
      if ((extraout_XMM0_Qa <= 15.0) && (uVar2 = std::isnan(pRVar5->alt_m), (uVar2 & 1) == 0)) {
        positionTy::lat(local_10);
        positionTy::lon(local_10);
        CoordAngle(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (double)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                   in_stack_fffffffffffffe38);
        ppVar11 = local_10;
        positionTy::heading(local_10);
        iVar10 = (int)ppVar11;
        HeadingDiff(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
        std::abs(iVar10);
        if (extraout_XMM0_Qa_00 <= local_50) {
          positionTy::lat(local_10);
          positionTy::lon(local_10);
          dVar12 = CoordDistance(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                                 (double)CONCAT44(in_stack_fffffffffffffe24,
                                                  in_stack_fffffffffffffe20),
                                 in_stack_fffffffffffffe18);
          if (dVar12 <= 37040.0) {
            dVar13 = dVar12 / local_18;
            in_stack_fffffffffffffe50 = positionTy::alt_m(local_10);
            dVar14 = in_stack_fffffffffffffe50 - pRVar5->alt_m;
            dVar15 = -dVar14 / dVar13;
            if (local_30 <= dVar15) {
              if (dVar14 <= 100.0) {
                if (dVar12 <= 3000.0) goto LAB_001a3744;
              }
              else if (dVar15 <= local_38) {
LAB_001a3744:
                local_40 = local_78;
                local_50 = extraout_XMM0_Qa_00;
                local_48 = pRVar5;
                in_stack_fffffffffffffe48 = positionTy::ts(local_10);
                local_58 = in_stack_fffffffffffffe48 + dVar13;
              }
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_RwyEndPt_*,_std::vector<RwyEndPt,_std::allocator<RwyEndPt>_>_>::
      operator++(local_98);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Apt>_>
                  *)in_stack_fffffffffffffe00);
  } while( true );
}

Assistant:

positionTy LTAptFindRwy (const LTAircraft::FlightModel& _mdl,
                         const positionTy& _from,
                         double _speed_m_s,
                         std::string& _rwyId,
                         const std::string& _logTxt)
{
    // --- Preparation of aircraft-related data ---
    // allowed VSI range depends on aircraft model, converted to m/s
    const double vsi_min = -_mdl.VSI_MAX * Ms_per_FTm;
    const double vsi_max =  _mdl.VSI_FINAL * ART_RWY_MAX_VSI_F * Ms_per_FTm;
    
    // The speed to use: cut off at a reasonable approach speed:
    if (_speed_m_s > _mdl.FLAPS_DOWN_SPEED * ART_APPR_SPEED_F / KT_per_M_per_S)
        _speed_m_s = _mdl.FLAPS_DOWN_SPEED * ART_APPR_SPEED_F / KT_per_M_per_S;
    
    // --- Variables holding Best Match ---
    const Apt* bestApt = nullptr;               // best matching apt
    const RwyEndPt* bestRwyEndPt = nullptr;     // best matching runway endpoint
    // The heading diff of the best match to its runway
    // (initialized to the max allowed value so that worse heading diffs aren't considered)
    double bestHeadingDiff = ART_RWY_MAX_HEAD_DIFF;
    // when would we arrive there?
    double bestArrivalTS = NAN;
    
    // --- Iterate the airports ---
    // Access to the list of airports is guarded by a lock
    std::lock_guard<std::mutex> lock(mtxGMapApt);

    // loop over airports
    for (mapAptTy::const_iterator iterApt = gmapApt.cbegin();
         iterApt != gmapApt.cend();
         ++iterApt)
    {
        const Apt& apt = iterApt->second;
        
        // Find the rwy endpoints matching the current plane's heading
        for (const RwyEndPt& re: apt.GetRwyEndPtVec())
        {
            // skip if rwy heading differs too much from flight heading
            if (std::abs(HeadingDiff(re.heading, _from.heading())) > ART_RWY_MAX_HEAD_DIFF)
                continue;
            
            // We need to know the runway's altitude for what comes next
            if (std::isnan(re.alt_m))
                continue;
            
            // Heading towards rwy, compared to current flight's heading
            // (Find the rwy which requires least turn now.)
            const double bearing = CoordAngle(_from.lat(), _from.lon(), re.lat, re.lon);
            const double headingDiff = std::abs(HeadingDiff(_from.heading(), bearing));
            if (headingDiff > bestHeadingDiff)      // worse than best known match?
                continue;
            
            // 3. Vertical speed, for which we need to know distance / flying time
            const double dist = CoordDistance(_from.lat(), _from.lon(), re.lat, re.lon);
            if (dist > ART_RWY_MAX_DIST)        // too far out
                continue;
            const double d_ts = dist / _speed_m_s;
            const double agl = _from.alt_m() - re.alt_m;
            const double vsi = (-agl) / d_ts;
            if (vsi < vsi_min)                  // would need too steep sinking?
                continue;
            
            // flying more than 300ft/100m above ground?
            if (agl > 100.0) {
                // also consider max_vsi
                if (vsi > vsi_max)              // would fly too flat? -> too far out?
                    continue;
            } else {
                // pretty close too the ground, cut off at shorter distance
                if (dist > 3000.0)              // 3000m is a runway length...we shouldn't look further that close to the ground
                    continue;
            }
            
            // We've got a match!
            bestApt = &apt;
            bestRwyEndPt = &re;
            bestHeadingDiff = headingDiff;      // the heading diff (which would be a selection criterion on several rwys match)
            bestArrivalTS = _from.ts() + d_ts;   // the arrival timestamp
        }
    }
    
    // Didn't find a suitable runway?
    if (!bestRwyEndPt || !bestApt) {
        if (!_logTxt.empty())
            LOG_MSG(logDEBUG, "Didn't find runway for %s with heading %.0f",
                    _logTxt.c_str(),
                    _from.heading());
        _rwyId.clear();
        return positionTy();
    }
    
    // Found a match!
    positionTy retPos = positionTy(bestRwyEndPt->lat,
                                   bestRwyEndPt->lon,
                                   bestRwyEndPt->alt_m,
                                   bestArrivalTS,
                                   bestRwyEndPt->heading,
                                   _mdl.PITCH_FLARE,
                                   0.0,
                                   GND_ON,
                                   UNIT_WORLD, UNIT_DEG,
                                   FPH_TOUCH_DOWN);
    retPos.f.bHeadFixed = true;
    retPos.f.specialPos = SPOS_RWY;
    _rwyId = bestApt->GetId();
    _rwyId += '/';
    _rwyId += bestRwyEndPt->id;
    if (!_logTxt.empty())
        LOG_MSG(logDEBUG, "Found runway %s at %s for %s",
                _rwyId.c_str(),
                std::string(retPos).c_str(),
                _logTxt.c_str());
    return retPos;
}